

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTargetInternals::ProcessSourceItemCMP0049
          (string *__return_storage_ptr__,cmTargetInternals *this,string *s)

{
  cmMakefile *this_00;
  MessageType t;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  PolicyID id;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  MessageType local_1d0;
  byte local_1c9;
  MessageType messageType;
  bool noMessage;
  ostringstream e;
  undefined1 local_40 [8];
  string src;
  string *s_local;
  cmTargetInternals *this_local;
  
  src.field_2._8_8_ = s;
  std::__cxx11::string::string((string *)local_40,(string *)s);
  cmMakefile::ExpandVariablesInString(this->Makefile,(string *)local_40);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)src.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType);
    local_1c9 = 0;
    local_1d0 = AUTHOR_WARNING;
    PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0049,false);
    if (PVar2 == OLD) {
      local_1c9 = 1;
    }
    else if (PVar2 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x31,id);
      poVar3 = std::operator<<((ostream *)&messageType,(string *)&local_1f0);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    else if (PVar2 - NEW < 3) {
      local_1d0 = FATAL_ERROR;
    }
    if ((local_1c9 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&messageType,"Legacy variable expansion in source file \""
                              );
      poVar3 = std::operator<<(poVar3,(string *)src.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,"\" expanded to \"");
      poVar3 = std::operator<<(poVar3,(string *)local_40);
      poVar3 = std::operator<<(poVar3,"\" in target \"");
      poVar3 = std::operator<<(poVar3,(string *)&this->Name);
      std::operator<<(poVar3,"\".  This behavior will be removed in a future version of CMake.");
      t = local_1d0;
      this_00 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,t,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (local_1d0 != FATAL_ERROR) goto LAB_001d2484;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_211);
      std::allocator<char>::~allocator(&local_211);
      bVar1 = true;
    }
    else {
LAB_001d2484:
      bVar1 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType);
    if (bVar1) goto LAB_001d24d0;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
LAB_001d24d0:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTargetInternals::ProcessSourceItemCMP0049(const std::string& s)
{
  std::string src = s;

  // For backwards compatibility replace variables in source names.
  // This should eventually be removed.
  this->Makefile->ExpandVariablesInString(src);
  if (src != s) {
    std::ostringstream e;
    bool noMessage = false;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0049)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0049) << "\n";
        break;
      case cmPolicies::OLD:
        noMessage = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
    }
    if (!noMessage) {
      e << "Legacy variable expansion in source file \"" << s
        << "\" expanded to \"" << src << "\" in target \"" << this->Name
        << "\".  This behavior will be removed in a "
           "future version of CMake.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return "";
      }
    }
  }
  return src;
}